

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::tlssPop(void)

{
  String *in_RDI;
  anon_class_416_2_abd2a4d0 *in_stack_00000078;
  
  g_oss();
  anon_class_416_2_abd2a4d0::pop(in_stack_00000078);
  return in_RDI;
}

Assistant:

String tlssPop() {
        return g_oss.pop();
    }